

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-compress.c
# Opt level: O1

int main(int argc,char **argv)

{
  FILE *__stream;
  long lVar1;
  FILE *__stream_00;
  uint uVar2;
  char *__filename;
  KosinskiCompressCallbacks callbacks;
  KosinskiCompressCallbacks local_50;
  
  if (argc < 2) {
    fputs("This tool compresses a supplied file in the Kosinski format. It tries to produce files accurate to Sega\'s original compressor.\n\nwww.github.com/Clownacy/accurate-kosinski\n\nUsage: kosinski-compress [in_file] [out_file](optional)\n"
          ,_stdout);
    uVar2 = 0;
  }
  else {
    __stream = fopen(argv[1],"rb");
    if (__stream == (FILE *)0x0) {
      main_cold_1();
      uVar2 = 1;
    }
    else {
      fseek(__stream,0,2);
      lVar1 = ftell(__stream);
      rewind(__stream);
      fprintf(_stderr,"File \'%s\' with size %lX loaded\n",argv[1],lVar1);
      if (argc == 2) {
        __filename = "out.kos";
      }
      else {
        __filename = argv[2];
      }
      __stream_00 = fopen(__filename,"wb");
      if (__stream_00 == (FILE *)0x0) {
        fprintf(_stderr,"Could not open \'%s\'\n",__filename);
      }
      else {
        local_50.read_byte = ReadByte;
        local_50.write_byte = WriteByte;
        local_50.read_byte_user_data = __stream;
        local_50.write_byte_user_data = __stream_00;
        KosinskiCompress(&local_50,'\x01');
        fclose(__stream_00);
      }
      uVar2 = (uint)(__stream_00 == (FILE *)0x0);
      fclose(__stream);
    }
  }
  return uVar2;
}

Assistant:

int main(const int argc, char** const argv)
{
	int exit_code = EXIT_SUCCESS;

	if (argc < 2)
	{
		fputs(
			"This tool compresses a supplied file in the Kosinski format. It tries to produce files accurate to Sega's original compressor.\n"
			"\n"
			"www.github.com/Clownacy/accurate-kosinski\n"
			"\n"
			"Usage: kosinski-compress [in_file] [out_file](optional)\n"
			, stdout
		);
	}
	else
	{
		FILE* const in_file = fopen(argv[1], "rb");

		if (in_file == NULL)
		{
			exit_code = EXIT_FAILURE;
			fprintf(stderr, "Could not open '%s'\n", argv[1]);
		}
		else
		{
			const char *out_filename;
			FILE *out_file;

		#ifdef DEBUG
			unsigned long file_size;
			fseek(in_file, 0, SEEK_END);
			file_size = ftell(in_file);
			rewind(in_file);

			fprintf(stderr, "File '%s' with size %lX loaded\n", argv[1], file_size);
		#endif

			out_filename = (argc > 2) ? argv[2] : "out.kos";
			out_file = fopen(out_filename, "wb");

			if (out_file == NULL)
			{
				exit_code = EXIT_FAILURE;
				fprintf(stderr, "Could not open '%s'\n", out_filename);
			}
			else
			{
				KosinskiCompressCallbacks callbacks;
				callbacks.read_byte_user_data = in_file;
				callbacks.read_byte = ReadByte;
				callbacks.write_byte_user_data = out_file;
				callbacks.write_byte = WriteByte;

				KosinskiCompress(&callbacks,
				#ifdef DEBUG
					cc_true
				#else
					cc_false
				#endif
				);

				fclose(out_file);
			}

			fclose(in_file);
		}
	}

	return exit_code;
}